

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_initialize(void)

{
  char *pcVar1;
  proc_list_t *ppVar2;
  int iVar3;
  global_array_t *pgVar4;
  long lVar5;
  int *piVar6;
  Integer IVar7;
  Integer IVar8;
  Integer count;
  Integer *list;
  Integer IVar9;
  MPI_Comm poVar10;
  long lVar11;
  ulong uVar12;
  Integer i;
  Integer j;
  long local_48;
  Integer local_40;
  Integer local_38;
  
  if (GAinitialized != '\0') {
    return;
  }
  if (ARMCIinitialized != '\0') goto LAB_0015cf66;
  if (GA_memory_limited == '\x01') {
    ARMCI_Set_shm_limit(GA_total_memory);
  }
  if (_ga_initialize_c == 0) {
    if (_ga_initialize_f != 0) {
      piVar6 = (int *)malloc(4);
      _ga_argc = piVar6;
      _ga_argv = (char ***)malloc(8);
      if (piVar6 == (int *)0x0) {
        pnga_error("malloc argc failed",1);
        piVar6 = _ga_argc;
      }
      ga_f2c_get_cmd_args(piVar6,_ga_argv);
      goto LAB_0015cf40;
    }
    pnga_error("pnga_initialize called outside of C or F APIs",1);
  }
  else if (_ga_initialize_args == 0) {
    ARMCI_Init();
  }
  else {
LAB_0015cf40:
    ARMCI_Init_args(_ga_argc,_ga_argv);
  }
  ARMCIinitialized = '\x01';
LAB_0015cf66:
  GA_Default_Proc_Group = -1;
  pgVar4 = (global_array_t *)malloc(0x1b40000);
  _ga_main_data_structure = pgVar4;
  _proc_list_main_data_structure = (proc_list_t *)malloc(0x140000);
  if (pgVar4 == (global_array_t *)0x0) {
    pnga_error("ga_init:malloc ga failed",0);
  }
  if (_proc_list_main_data_structure == (proc_list_t *)0x0) {
    pnga_error("ga_init:malloc proc_list failed",0);
  }
  GA = _ga_main_data_structure;
  lVar5 = 0;
  PGRP_LIST = _proc_list_main_data_structure;
  for (lVar11 = 0; lVar11 != 0x1b40000; lVar11 = lVar11 + 0x368) {
    pcVar1 = GA->name + lVar11 + -0x10;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1 = GA->name + lVar11 + -8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(undefined8 *)((long)GA->old_nblock + lVar11 + -0x38) = 0;
    *(undefined8 *)((long)GA->old_nblock + lVar11 + -0x18) = 0;
    pgVar4 = GA;
    *(undefined4 *)((long)GA->old_nblock + lVar11 + -0x10) = 0;
    pcVar1 = pgVar4->mem_dev + lVar11 + -4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    *(undefined4 *)((long)pgVar4->dims + lVar11 + -0x28) = 0;
    *(int *)((long)pgVar4->block_dims + lVar11 + -0x18) = GA_Init_Proc_Group;
    pcVar1 = pgVar4->mem_dev + lVar11 + 0x20;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    *(undefined8 *)((long)&PGRP_LIST->map_proc_list + lVar5) = 0;
    *(undefined8 *)((long)&PGRP_LIST->inv_map_proc_list + lVar5) = 0;
    *(undefined4 *)((long)&PGRP_LIST->actv + lVar5) = 0;
    lVar5 = lVar5 + 0x28;
  }
  GAstat.numsca_procs = 0;
  GAstat.numgat_procs = 0;
  GAstat.numput_procs = 0;
  GAstat.numacc_procs = 0;
  GAstat.maxmem = 0;
  GAstat.numget_procs = 0;
  GAstat.numser = 0;
  GAstat.curmem = 0;
  GAstat.numgat = 0;
  GAstat.numrdi = 0;
  GAstat.numacc = 0;
  GAstat.numsca = 0;
  GAstat.numget = 0;
  GAstat.numput = 0;
  GAstat.numcre = 0;
  GAstat.numdes = 0;
  gai_nb_init();
  iVar3 = armci_msg_nproc();
  GAnproc = (Integer)iVar3;
  mapALL = (Integer *)malloc(GAnproc * 8 + 0x30);
  iVar3 = armci_msg_me();
  GAme = (Integer)iVar3;
  if ((iVar3 < 0) || (GAnproc < GAme)) {
    pnga_error("ga_init:message-passing initialization problem: my ID=",GAme);
  }
  armci_msg_me();
  gai_init_onesided();
  piVar6 = &GA->actv;
  for (local_48 = 0; uVar12 = (ulong)_max_global_array, local_48 < (long)uVar12;
      local_48 = local_48 + 1) {
    *piVar6 = 0;
    piVar6 = piVar6 + 0xda;
  }
  piVar6 = &GA->actv_handle;
  for (lVar5 = 0; IVar7 = GAnproc, lVar5 < (int)uVar12; lVar5 = lVar5 + 1) {
    *piVar6 = 0;
    uVar12 = (ulong)(uint)_max_global_array;
    piVar6 = piVar6 + 0xda;
  }
  piVar6 = (int *)malloc(GAnproc * 8);
  ppVar2 = PGRP_LIST;
  PGRP_LIST->map_proc_list = piVar6;
  ppVar2->inv_map_proc_list = piVar6 + IVar7;
  lVar5 = 0;
  IVar8 = IVar7;
  if (IVar7 < 1) {
    IVar8 = lVar5;
  }
  for (; IVar8 != lVar5; lVar5 = lVar5 + 1) {
    piVar6[lVar5] = -1;
  }
  for (lVar5 = 0; IVar8 != lVar5; lVar5 = lVar5 + 1) {
    (piVar6 + IVar7)[lVar5] = -1;
  }
  lVar11 = 0;
  IVar7 = pnga_cluster_nodeid();
  IVar8 = pnga_cluster_nprocs(IVar7);
  local_40 = IVar7;
  IVar7 = pnga_cluster_procid(IVar7,0);
  ppVar2 = PGRP_LIST;
  ppVar2->actv = 1;
  ppVar2->parent = -1;
  ppVar2->map_nproc = (int)IVar8;
  ppVar2->mirrored = 1;
  lVar5 = 0;
  if (0 < IVar8) {
    lVar5 = IVar8;
  }
  for (; lVar5 != lVar11; lVar11 = lVar11 + 1) {
    ppVar2->map_proc_list[IVar7 + lVar11] = (int)lVar11;
    ppVar2->inv_map_proc_list[lVar11] = (int)IVar7 + (int)lVar11;
  }
  lVar5 = (long)GA_World_Proc_Group;
  local_48 = IVar8;
  IVar7 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(lVar5,IVar7,&local_48,1,"max");
  lVar5 = (long)GA_World_Proc_Group;
  local_38 = IVar8;
  IVar7 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(lVar5,IVar7,&local_38,1,"min");
  if (local_48 == local_38) {
    lVar5 = 0;
    count = pnga_cluster_nnodes();
    list = (Integer *)malloc(count * 8);
    IVar7 = GAme;
    IVar9 = pnga_cluster_procid(local_40,0);
    lVar11 = IVar7 - IVar9;
    local_48 = count;
    if (count < 1) {
      local_48 = lVar5;
    }
    for (; local_48 != lVar5; lVar5 = lVar5 + 1) {
      list[lVar5] = lVar11;
      lVar11 = lVar11 + IVar8;
    }
    _mirror_gop_grp = pnga_pgroup_create(list,count);
    free(list);
  }
  else {
    _mirror_gop_grp = (Integer)GA_World_Proc_Group;
  }
  GA_Update_Flags = (int **)malloc(GAnproc << 3);
  if (GA_Update_Flags == (int **)0x0) {
    pnga_error("ga_init: Failed to initialize GA_Update_Flags",(long)(int)GAme);
  }
  iVar3 = ARMCI_Malloc(GA_Update_Flags,0x38);
  if (iVar3 != 0) {
    pnga_error("ga_init:Failed to initialize memory for update flags",GAme);
  }
  if (GA_Update_Flags[GAme] == (int *)0x0) {
    pnga_error("ga_init:ARMCIMalloc failed",GAme);
  }
  GA_Update_Signal = (int *)ARMCI_Malloc_local(4);
  piVar6 = GA_Update_Flags[GAme];
  for (lVar5 = 0; lVar5 != 0xe; lVar5 = lVar5 + 1) {
    piVar6[lVar5] = 0;
  }
  local_48 = 0xe;
  MA_set_error_callback(ARMCI_Error);
  GAinitialized = 1;
  poVar10 = GA_MPI_Comm_pgroup(-1);
  MPI_Comm_dup(poVar10,&GA_MPI_World_comm_dup);
  sai_init_sparse_arrays();
  return;
}

Assistant:

void pnga_initialize()
{
    Integer  i, j,nproc, nnode, zero;
    int bytes;
    GA_Internal_Threadsafe_Lock();
#ifdef MSG_COMMS_MPI
        MPI_Comm comm;
#endif

    if(GAinitialized)
    {
        GA_Internal_Threadsafe_Unlock();
        return;
    }

#if HAVE_ARMCI_INITIALIZED_FUNCTION
    if (!ARMCI_Initialized())
#else
    if (!ARMCIinitialized)
#endif
    {
        /* assure that GA will not alocate more shared memory than specified */
        if(GA_memory_limited) ARMCI_Set_shm_limit(GA_total_memory);
        if (_ga_initialize_c) {
            if (_ga_initialize_args) {
                ARMCI_Init_args(_ga_argc, _ga_argv);
            }
            else {
                ARMCI_Init();
            }
        }
        else if (_ga_initialize_f) {
            _ga_argc = malloc(sizeof(int));
            _ga_argv = malloc(sizeof(char**));
            if (!_ga_argc) pnga_error("malloc argc failed",1);
            ga_f2c_get_cmd_args(_ga_argc, _ga_argv);
            ARMCI_Init_args(_ga_argc, _ga_argv);
        }
        else {
            pnga_error("pnga_initialize called outside of C or F APIs",1);
        }
        ARMCIinitialized = 1;
    }
    
    GA_Default_Proc_Group = -1;
    /* zero in pointers in GA array */
    _ga_main_data_structure
       = (global_array_t *)malloc(sizeof(global_array_t)*MAX_ARRAYS);
    _proc_list_main_data_structure
       = (proc_list_t *)malloc(sizeof(proc_list_t)*MAX_ARRAYS);
    if(!_ga_main_data_structure)
       pnga_error("ga_init:malloc ga failed",0);
    if(!_proc_list_main_data_structure)
       pnga_error("ga_init:malloc proc_list failed",0);
    GA = _ga_main_data_structure;
    PGRP_LIST = _proc_list_main_data_structure;
    for(i=0;i<MAX_ARRAYS; i++) {
       GA[i].ptr  = (char**)0;
       GA[i].mapc = (C_Integer*)0;
       GA[i].rstrctd_list = (C_Integer*)0;
       GA[i].rank_rstrctd = (C_Integer*)0;
       GA[i].property = NO_PROPERTY;
       GA[i].mem_dev_set = 0;
#ifdef ENABLE_CHECKPOINT
       GA[i].record_id = 0;
#endif
       GA[i].actv = 0;
       GA[i].p_handle = GA_Init_Proc_Group;
       GA[i].overlay = 0;
       PGRP_LIST[i].map_proc_list = (int*)0;
       PGRP_LIST[i].inv_map_proc_list = (int*)0;
       PGRP_LIST[i].actv = 0;
    }

    bzero(&GAstat,sizeof(GAstat));

    /* initialize some data structures used in non-blocking communication */
    gai_nb_init();

    GAnproc = (Integer)armci_msg_nproc();

    /* Allocate arrays used by library */
    mapALL = (Integer*)malloc((GAnproc+MAXDIM-1)*sizeof(Integer*));

    GAme = (Integer)armci_msg_me();
    if(GAme<0 || GAme>GAnproc) 
       pnga_error("ga_init:message-passing initialization problem: my ID=",GAme);

    MPme= (Integer)armci_msg_me();

    gai_init_onesided();

    /* set activity status for all arrays to inactive */
    for(i=0;i<_max_global_array;i++)GA[i].actv=0;
    for(i=0;i<_max_global_array;i++)GA[i].actv_handle=0;

    /* Create proc list for mirrored arrays */
    PGRP_LIST[0].map_proc_list = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[0].inv_map_proc_list = PGRP_LIST[0].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++) PGRP_LIST[0].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++) PGRP_LIST[0].inv_map_proc_list[i] = -1;
    nnode = pnga_cluster_nodeid();
    nproc = pnga_cluster_nprocs(nnode);
    zero = 0;
    j = pnga_cluster_procid(nnode, zero);
    PGRP_LIST[0].parent = -1;
    PGRP_LIST[0].actv = 1;
    PGRP_LIST[0].map_nproc = nproc;
    PGRP_LIST[0].mirrored = 1;
    for (i=0; i<nproc; i++) {
       PGRP_LIST[0].map_proc_list[i+j] = i;
       PGRP_LIST[0].inv_map_proc_list[i] = i+j;
    }

    /* Set up group for doing cluster merge. Start by checking if
     * number of procs per node is the same for all nodes */
    i = nproc;
    pnga_pgroup_gop(GA_World_Proc_Group,pnga_type_f2c(MT_F_INT),&i,1,"max");
    j = nproc;
    pnga_pgroup_gop(GA_World_Proc_Group,pnga_type_f2c(MT_F_INT),&j,1,"min");
    if (i == j) {
      /* construct a group that containing all processors with the same local
       * proc ID across all nodes in the system */
      Integer numnodes = pnga_cluster_nnodes();
      Integer *nodelist = (Integer*)malloc(numnodes*sizeof(Integer));
      Integer myproc = GAme-pnga_cluster_procid(nnode,zero);
      for (i=0; i<numnodes; i++) {
        nodelist[i] = i*nproc+myproc;
      }
      _mirror_gop_grp = pnga_pgroup_create(nodelist,numnodes);
      free(nodelist);
    } else {
      _mirror_gop_grp = GA_World_Proc_Group;
    }



    /* Allocate memory for update flags and signal*/
    bytes = 2*MAXDIM*sizeof(int);
    GA_Update_Flags = (int**)malloc(GAnproc*sizeof(void*));
    if (!GA_Update_Flags)
      pnga_error("ga_init: Failed to initialize GA_Update_Flags",(int)GAme);
    if (ARMCI_Malloc((void**)GA_Update_Flags, (armci_size_t) bytes))
      pnga_error("ga_init:Failed to initialize memory for update flags",GAme);
    if(GA_Update_Flags[GAme]==NULL)pnga_error("ga_init:ARMCIMalloc failed",GAme);

    bytes = sizeof(int);
    GA_Update_Signal = ARMCI_Malloc_local((armci_size_t) bytes);

    /* Zero update flags */
    for (i=0; i<2*MAXDIM; i++) {
		GA_Update_Flags[GAme][i] = 0;
	}

    /* set MA error function */
    MA_set_error_callback(ARMCI_Error);

    GAinitialized = 1;

#ifdef PROFILE_OLD 
    ga_profile_init();
#endif
#ifdef ENABLE_CHECKPOINT
    {
    Integer tmplist[1000];
    Integer tmpcount;
    tmpcount = GAnproc-ga_spare_procs;
    for(i=0;i<tmpcount;i++)
            tmplist[i]=i;
    ga_group_is_for_ft=1;
    GA_Default_Proc_Group = pnga_pgroup_create(tmplist,tmpcount);
    ga_group_is_for_ft=0;
    if(GAme>=tmpcount)
      ga_irecover(0);
    printf("\n%d:here done with initialize\n",GAme);
                 
    }
#endif
    /* create duplicate of world communicator */
#ifdef MSG_COMMS_MPI
    comm =  GA_MPI_Comm_pgroup(-1);
    MPI_Comm_dup(comm, &GA_MPI_World_comm_dup);
#endif
    sai_init_sparse_arrays();
    GA_Internal_Threadsafe_Unlock();
}